

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

int iniparser_getboolean(dictionary *d,char *key,int notfound)

{
  char *pcVar1;
  char *c;
  int ret;
  int notfound_local;
  char *key_local;
  dictionary *d_local;
  
  pcVar1 = iniparser_getstring(d,key,(char *)0xffffffffffffffff);
  d_local._4_4_ = notfound;
  if (pcVar1 != (char *)0xffffffffffffffff) {
    if ((((*pcVar1 == 'y') || (*pcVar1 == 'Y')) || (*pcVar1 == '1')) ||
       ((*pcVar1 == 't' || (*pcVar1 == 'T')))) {
      c._0_4_ = 1;
    }
    else if (((*pcVar1 == 'n') || (*pcVar1 == 'N')) ||
            ((*pcVar1 == '0' || ((*pcVar1 == 'f' || (c._0_4_ = notfound, *pcVar1 == 'F')))))) {
      c._0_4_ = 0;
    }
    d_local._4_4_ = (int)c;
  }
  return d_local._4_4_;
}

Assistant:

int iniparser_getboolean(const dictionary * d, const char * key, int notfound)
{
    int          ret ;
    const char * c ;

    c = iniparser_getstring(d, key, INI_INVALID_KEY);
    if (c == INI_INVALID_KEY) return notfound ;
    if (c[0] == 'y' || c[0] == 'Y' || c[0] == '1' || c[0] == 't' || c[0] == 'T') {
        ret = 1 ;
    } else if (c[0] == 'n' || c[0] == 'N' || c[0] == '0' || c[0] == 'f' || c[0] == 'F') {
        ret = 0 ;
    } else {
        ret = notfound ;
    }
    return ret;
}